

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O2

CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
          (CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other)

{
  Matrix<double,__1,__1,_0,__1,__1> *xpr;
  long lVar1;
  uint __line;
  long lVar2;
  long lVar3;
  long lVar4;
  char *__assertion;
  long blockCols;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_50;
  
  xpr = *(Matrix<double,__1,__1,_0,__1,__1> **)this;
  lVar2 = *(long *)(this + 0x10);
  lVar1 = (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  blockCols = *(long *)(other + 0x10);
  if (lVar2 == lVar1) {
    if (blockCols == 0) {
      lVar4 = *(long *)(other + 8);
      lVar3 = *(long *)(this + 0x18);
      if (lVar4 == lVar3) {
        blockCols = 0;
        goto LAB_001496e2;
      }
    }
    else {
      lVar3 = *(long *)(this + 0x18);
      lVar4 = *(long *)(other + 8);
    }
    lVar2 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar3 + lVar2;
    *(undefined8 *)(this + 0x10) = 0;
    *(long *)(this + 0x18) = lVar4;
    if ((xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows <
        lVar3 + lVar2 + lVar4) {
      __assertion = 
      "m_row+m_currentBlockRows<=m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
      ;
      __line = 0x59;
      goto LAB_0014976f;
    }
    lVar2 = 0;
  }
LAB_001496e2:
  if (lVar1 < blockCols + lVar2) {
    __assertion = 
    "(m_col + other.cols() <= m_xpr.cols()) && \"Too many coefficients passed to comma initializer (operator<<)\""
    ;
    __line = 0x5c;
  }
  else {
    if (*(long *)(this + 0x18) == *(long *)(other + 8)) {
      Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_50,xpr,*(Index *)(this + 8),lVar2,*(long *)(this + 0x18),blockCols);
      internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (&local_50,(Matrix<double,__1,__1,_0,__1,__1> *)other);
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + *(long *)(other + 0x10);
      return (CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
    }
    __assertion = "m_currentBlockRows==other.rows()";
    __line = 0x5d;
  }
LAB_0014976f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/CommaInitializer.h"
                ,__line,
                "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const DenseBase<OtherDerived>& other)
  {
    if (m_col==m_xpr.cols() && (other.cols()!=0 || other.rows()!=m_currentBlockRows))
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = other.rows();
      eigen_assert(m_row+m_currentBlockRows<=m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert((m_col + other.cols() <= m_xpr.cols())
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==other.rows());
    m_xpr.template block<OtherDerived::RowsAtCompileTime, OtherDerived::ColsAtCompileTime>
                    (m_row, m_col, other.rows(), other.cols()) = other;
    m_col += other.cols();
    return *this;
  }